

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void db_drop_test(void)

{
  size_t *psVar1;
  long *plVar2;
  long *plVar3;
  void *pvVar4;
  undefined1 *puVar5;
  fdb_status fVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  size_t bodylen;
  fdb_kvs_config *pfVar10;
  time_t tVar11;
  uint8_t *puVar12;
  ulong uVar13;
  long lVar14;
  fdb_kvs_handle **ppfVar15;
  fdb_config *fconfig_00;
  uint uVar16;
  char *unaff_RBP;
  char *info;
  kvs_ops_stat *pkVar17;
  char *pcVar18;
  fdb_kvs_handle *pfVar19;
  fdb_doc *unaff_R12;
  code *unaff_R13;
  fdb_doc *pfVar20;
  char *info_00;
  btree *pbVar21;
  fdb_doc **doc;
  fdb_doc *pfVar22;
  bool bVar23;
  timeval tVar24;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  int iStack_16fc;
  fdb_doc *pfStack_16f8;
  fdb_file_handle *pfStack_16f0;
  undefined4 uStack_16e8;
  undefined3 uStack_16e4;
  undefined1 uStack_16e1;
  fdb_kvs_handle *pfStack_16e0;
  uint uStack_16d4;
  timeval tStack_16d0;
  timeval tStack_16c0;
  timeval tStack_16b0;
  fdb_file_info fStack_16a0;
  char acStack_1658 [1032];
  fdb_config *pfStack_1250;
  fdb_doc *pfStack_1248;
  fdb_doc *pfStack_1240;
  btree *pbStack_1238;
  fdb_doc *pfStack_1230;
  kvs_ops_stat *pkStack_1228;
  btree *pbStack_1218;
  fdb_kvs_handle *pfStack_1210;
  fdb_doc *pfStack_1208;
  fdb_iterator *pfStack_1200;
  undefined8 uStack_11f8;
  fdb_kvs_handle *apfStack_11f0 [4];
  undefined1 auStack_11d0 [64];
  undefined1 auStack_1190 [32];
  undefined1 auStack_1170 [56];
  undefined1 auStack_1138 [40];
  fdb_doc fStack_1110;
  char acStack_10c0 [256];
  undefined1 auStack_fc0 [16];
  undefined1 auStack_fb0 [16];
  undefined1 auStack_fa0 [16];
  undefined1 auStack_f90 [16];
  undefined1 auStack_f80 [16];
  fdb_doc afStack_f70 [3];
  fdb_config fStack_e70;
  char *pcStack_d78;
  fdb_doc *pfStack_d70;
  fdb_doc *pfStack_d68;
  fdb_config *pfStack_d60;
  undefined1 *puStack_d58;
  code *pcStack_d50;
  undefined1 auStack_d48 [24];
  fdb_config fStack_d30;
  char acStack_c38 [256];
  char acStack_b38 [256];
  fdb_kvs_handle **ppfStack_a38;
  fdb_kvs_config *pfStack_a30;
  fdb_doc **ppfStack_a28;
  fdb_doc *pfStack_a10;
  fdb_kvs_handle *pfStack_a08;
  fdb_kvs_handle *pfStack_a00;
  fdb_file_handle *pfStack_9f8;
  fdb_kvs_handle *pfStack_9f0;
  fdb_kvs_config fStack_9e8;
  timeval tStack_9d0;
  fdb_doc *apfStack_9c0 [31];
  fdb_config fStack_8c8;
  char acStack_7d0 [256];
  char acStack_6d0 [256];
  char acStack_5d0 [264];
  fdb_kvs_handle **ppfStack_4c8;
  fdb_doc *pfStack_4c0;
  fdb_doc *pfStack_4b8;
  fdb_kvs_config *pfStack_4b0;
  fdb_doc *pfStack_4a8;
  code *pcStack_4a0;
  fdb_kvs_handle *local_490;
  undefined1 local_488 [16];
  fdb_kvs_config local_478;
  fdb_kvs_config local_458;
  timeval local_440;
  fdb_config local_430;
  fdb_doc local_338 [3];
  fdb_doc local_238 [3];
  fdb_kvs_config local_138 [11];
  
  pcStack_4a0 = (code *)0x112256;
  gettimeofday(&local_440,(__timezone_ptr_t)0x0);
  pcStack_4a0 = (code *)0x11225b;
  memleak_start();
  local_490 = (fdb_kvs_handle *)0x0;
  pcStack_4a0 = (code *)0x112270;
  system("rm -rf  dummy* > errorlog.txt");
  pcStack_4a0 = (code *)0x11227d;
  fdb_get_default_config();
  pfVar10 = &local_458;
  pcStack_4a0 = (code *)0x11228a;
  fdb_get_default_kvs_config();
  local_430.buffercache_size = 0x1000000;
  local_430.wal_threshold = 0x400;
  local_430.flags = 1;
  local_430.compaction_threshold = '\0';
  pfVar22 = (fdb_doc *)(local_488 + 8);
  pcStack_4a0 = (code *)0x1122bc;
  fdb_open((fdb_file_handle **)pfVar22,"./dummy1",&local_430);
  ppfVar15 = (fdb_kvs_handle **)local_488;
  pcStack_4a0 = (code *)0x1122d1;
  fdb_kvs_open((fdb_file_handle *)local_488._8_8_,ppfVar15,(char *)0x0,pfVar10);
  pcStack_4a0 = (code *)0x1122e7;
  fVar6 = fdb_set_log_callback((fdb_kvs_handle *)local_488._0_8_,logCallbackFunc,"db_drop_test");
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pfVar10 = local_138;
    pcStack_4a0 = (code *)0x11230a;
    sprintf(&pfVar10->create_if_missing,"key%d",0);
    unaff_R12 = local_238;
    pcStack_4a0 = (code *)0x112325;
    sprintf((char *)unaff_R12,"meta%d",0);
    unaff_R13 = (code *)local_338;
    pcStack_4a0 = (code *)0x112340;
    sprintf((char *)unaff_R13,"body%d",0);
    pcStack_4a0 = (code *)0x112348;
    sVar8 = strlen(&pfVar10->create_if_missing);
    pcStack_4a0 = (code *)0x112353;
    sVar9 = strlen((char *)unaff_R12);
    pcStack_4a0 = (code *)0x11235e;
    bodylen = strlen((char *)unaff_R13);
    pcStack_4a0 = (code *)0x11237e;
    fdb_doc_create((fdb_doc **)&local_478,pfVar10,sVar8,unaff_R12,sVar9,unaff_R13,bodylen);
    pfVar22 = (fdb_doc *)local_488;
    pcStack_4a0 = (code *)0x11238e;
    fdb_set((fdb_kvs_handle *)local_488._0_8_,(fdb_doc *)local_478._0_8_);
    pcStack_4a0 = (code *)0x1123a4;
    sprintf(&pfVar10->create_if_missing,"key%d",1);
    pcStack_4a0 = (code *)0x1123ba;
    sprintf((char *)unaff_R12,"meta%d",1);
    pcStack_4a0 = (code *)0x1123d0;
    sprintf((char *)unaff_R13,"body%d",1);
    pcStack_4a0 = (code *)0x1123d8;
    unaff_RBP = (char *)strlen(&pfVar10->create_if_missing);
    pcStack_4a0 = (code *)0x1123e3;
    sVar8 = strlen((char *)unaff_R12);
    pcStack_4a0 = (code *)0x1123ee;
    sVar9 = strlen((char *)unaff_R13);
    pcStack_4a0 = (code *)0x11240b;
    fdb_doc_create((fdb_doc **)&local_478.custom_cmp,pfVar10,(size_t)unaff_RBP,unaff_R12,sVar8,
                   unaff_R13,sVar9);
    pcStack_4a0 = (code *)0x11241c;
    fdb_set((fdb_kvs_handle *)local_488._0_8_,(fdb_doc *)local_478.custom_cmp);
    ppfVar15 = (fdb_kvs_handle **)(local_488 + 8);
    pcStack_4a0 = (code *)0x11242b;
    fdb_commit((fdb_file_handle *)local_488._8_8_,'\0');
    pcStack_4a0 = (code *)0x112433;
    fdb_kvs_close((fdb_kvs_handle *)local_488._0_8_);
    pcStack_4a0 = (code *)0x11243b;
    fdb_close((fdb_file_handle *)local_488._8_8_);
    pcStack_4a0 = (code *)0x112447;
    system("rm -rf  dummy1 > errorlog.txt");
    pcStack_4a0 = (code *)0x11245b;
    fdb_open((fdb_file_handle **)ppfVar15,"./dummy1",&local_430);
    pcStack_4a0 = (code *)0x11246b;
    fdb_kvs_open_default((fdb_file_handle *)local_488._8_8_,(fdb_kvs_handle **)pfVar22,&local_458);
    pcStack_4a0 = (code *)0x112481;
    fVar6 = fdb_set_log_callback((fdb_kvs_handle *)local_488._0_8_,logCallbackFunc,"db_drop_test");
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112618;
    pcStack_4a0 = (code *)0x1124a4;
    sprintf(&local_138[0].create_if_missing,"key%d",0);
    pfVar22 = local_238;
    pcStack_4a0 = (code *)0x1124bf;
    sprintf((char *)pfVar22,"meta%d",0);
    unaff_R12 = local_338;
    pcStack_4a0 = (code *)0x1124da;
    sprintf((char *)unaff_R12,"body%d",0);
    pfVar10 = &local_478;
    pcStack_4a0 = (code *)0x1124e7;
    fdb_doc_free((fdb_doc *)local_478._0_8_);
    pcStack_4a0 = (code *)0x1124ef;
    unaff_R13 = (code *)strlen(&local_138[0].create_if_missing);
    pcStack_4a0 = (code *)0x1124fa;
    unaff_RBP = (char *)strlen((char *)pfVar22);
    pcStack_4a0 = (code *)0x112505;
    sVar8 = strlen((char *)unaff_R12);
    pcStack_4a0 = (code *)0x112520;
    fdb_doc_create((fdb_doc **)pfVar10,local_138,(size_t)unaff_R13,pfVar22,(size_t)unaff_RBP,
                   unaff_R12,sVar8);
    pcStack_4a0 = (code *)0x11252d;
    fdb_set((fdb_kvs_handle *)local_488._0_8_,(fdb_doc *)local_478._0_8_);
    pcStack_4a0 = (code *)0x112539;
    fdb_commit((fdb_file_handle *)local_488._8_8_,'\0');
    ppfVar15 = &local_490;
    pcStack_4a0 = (code *)0x112560;
    fdb_doc_create((fdb_doc **)ppfVar15,*(void **)(local_478._0_8_ + 0x20),
                   *(size_t *)local_478._0_8_,(void *)0x0,0,(void *)0x0,0);
    pcStack_4a0 = (code *)0x11256d;
    fVar6 = fdb_get((fdb_kvs_handle *)local_488._0_8_,(fdb_doc *)local_490);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      if (local_490->fhandle != (fdb_file_handle *)0x1) {
        pcStack_4a0 = (code *)0x11258b;
        db_drop_test();
      }
      pcStack_4a0 = (code *)0x112595;
      fdb_kvs_close((fdb_kvs_handle *)local_488._0_8_);
      pcStack_4a0 = (code *)0x11259f;
      fdb_close((fdb_file_handle *)local_488._8_8_);
      pcStack_4a0 = (code *)0x1125a9;
      fdb_doc_free((fdb_doc *)local_490);
      local_490 = (fdb_kvs_handle *)0x0;
      pcStack_4a0 = (code *)0x1125bc;
      fdb_doc_free((fdb_doc *)local_478._0_8_);
      pcStack_4a0 = (code *)0x1125c6;
      fdb_doc_free((fdb_doc *)local_478.custom_cmp);
      pcStack_4a0 = (code *)0x1125cb;
      fdb_shutdown();
      pcStack_4a0 = (code *)0x1125d0;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (db_drop_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pcStack_4a0 = (code *)0x112601;
      fprintf(_stderr,pcVar18,"Database drop test");
      return;
    }
  }
  else {
    pcStack_4a0 = (code *)0x112618;
    db_drop_test();
LAB_00112618:
    pcStack_4a0 = (code *)0x11261d;
    db_drop_test();
  }
  pcStack_4a0 = db_destroy_test;
  db_drop_test();
  ppfStack_a28 = (fdb_doc **)0x11263f;
  ppfStack_4c8 = ppfVar15;
  pfStack_4c0 = unaff_R12;
  pfStack_4b8 = (fdb_doc *)unaff_R13;
  pfStack_4b0 = pfVar10;
  pfStack_4a8 = pfVar22;
  pcStack_4a0 = (code *)unaff_RBP;
  gettimeofday(&tStack_9d0,(__timezone_ptr_t)0x0);
  ppfStack_a28 = (fdb_doc **)0x112644;
  memleak_start();
  pfStack_a08 = (fdb_kvs_handle *)0x0;
  ppfStack_a28 = (fdb_doc **)0x112659;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_a28 = (fdb_doc **)0x112669;
  fdb_get_default_config();
  pfVar10 = &fStack_9e8;
  ppfStack_a28 = (fdb_doc **)0x112676;
  fdb_get_default_kvs_config();
  fStack_8c8.buffercache_size = 0x1000000;
  fStack_8c8.wal_threshold = 0x400;
  fStack_8c8.flags = 1;
  fStack_8c8.compaction_threshold = '\0';
  doc = &pfStack_a10;
  ppfStack_a28 = (fdb_doc **)0x1126a8;
  fdb_open((fdb_file_handle **)doc,"./dummy1",&fStack_8c8);
  ppfVar15 = &pfStack_a00;
  ppfStack_a28 = (fdb_doc **)0x1126bd;
  fdb_kvs_open((fdb_file_handle *)pfStack_a10,ppfVar15,(char *)0x0,pfVar10);
  ppfStack_a28 = (fdb_doc **)0x1126d3;
  fVar6 = fdb_set_log_callback(pfStack_a00,logCallbackFunc,"db_destroy_test");
  if (fVar6 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_doc *)0x0;
    uVar13 = 0;
    do {
      ppfStack_a28 = (fdb_doc **)0x1126fb;
      sprintf(acStack_5d0,"key%d",uVar13 & 0xffffffff);
      ppfStack_a28 = (fdb_doc **)0x112713;
      sprintf(acStack_6d0,"meta%d",uVar13 & 0xffffffff);
      ppfStack_a28 = (fdb_doc **)0x11272b;
      sprintf(acStack_7d0,"body%d",uVar13 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_9c0 + (long)unaff_R12);
      ppfStack_a28 = (fdb_doc **)0x11273b;
      unaff_R13 = (code *)strlen(acStack_5d0);
      unaff_RBP = acStack_6d0;
      ppfStack_a28 = (fdb_doc **)0x11274e;
      pfVar10 = (fdb_kvs_config *)strlen(unaff_RBP);
      ppfStack_a28 = (fdb_doc **)0x11275e;
      sVar8 = strlen(acStack_7d0);
      ppfStack_a28 = (fdb_doc **)0x112783;
      fdb_doc_create(doc,acStack_5d0,(size_t)unaff_R13,unaff_RBP,(size_t)pfVar10,acStack_7d0,sVar8);
      ppfStack_a28 = (fdb_doc **)0x112792;
      fdb_set(pfStack_a00,apfStack_9c0[uVar13]);
      uVar13 = uVar13 + 1;
      unaff_R12 = (fdb_doc *)((long)unaff_R12 + 8);
    } while (uVar13 != 0x1e);
    ppfStack_a28 = (fdb_doc **)0x1127af;
    fdb_commit((fdb_file_handle *)pfStack_a10,'\0');
    ppfStack_a28 = (fdb_doc **)0x1127cb;
    fdb_open(&pfStack_9f8,"./dummy2",&fStack_8c8);
    ppfVar15 = &pfStack_9f0;
    ppfStack_a28 = (fdb_doc **)0x1127e2;
    fdb_kvs_open(pfStack_9f8,ppfVar15,(char *)0x0,&fStack_9e8);
    ppfStack_a28 = (fdb_doc **)0x1127f8;
    fVar6 = fdb_set_log_callback(pfStack_9f0,logCallbackFunc,"db_destroy_test");
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112987;
    lVar14 = 0;
    do {
      ppfStack_a28 = (fdb_doc **)0x112811;
      fdb_set(pfStack_9f0,apfStack_9c0[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x1e);
    ppfStack_a28 = (fdb_doc **)0x112826;
    fdb_commit(pfStack_9f8,'\0');
    ppfStack_a28 = (fdb_doc **)0x112830;
    fdb_close((fdb_file_handle *)pfStack_a10);
    ppfStack_a28 = (fdb_doc **)0x112844;
    fVar6 = fdb_destroy("./dummy2",&fStack_8c8);
    ppfVar15 = (fdb_kvs_handle **)0x1e;
    if (fVar6 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011298c;
    ppfStack_a28 = (fdb_doc **)0x112857;
    fdb_close(pfStack_9f8);
    ppfStack_a28 = (fdb_doc **)0x11286b;
    fVar6 = fdb_destroy("./dummy1",&fStack_8c8);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112991;
    ppfStack_a28 = (fdb_doc **)0x11288f;
    fdb_open((fdb_file_handle **)&pfStack_a10,"./dummy1",&fStack_8c8);
    ppfVar15 = &pfStack_a00;
    ppfStack_a28 = (fdb_doc **)0x1128a6;
    fdb_kvs_open((fdb_file_handle *)pfStack_a10,ppfVar15,(char *)0x0,&fStack_9e8);
    ppfStack_a28 = (fdb_doc **)0x1128bc;
    fVar6 = fdb_set_log_callback(pfStack_a00,logCallbackFunc,"db_destroy_test");
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112996;
    ppfVar15 = &pfStack_a08;
    ppfStack_a28 = (fdb_doc **)0x1128ed;
    fdb_doc_create((fdb_doc **)ppfVar15,apfStack_9c0[0]->key,apfStack_9c0[0]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    ppfStack_a28 = (fdb_doc **)0x1128fa;
    fVar6 = fdb_get(pfStack_a00,(fdb_doc *)pfStack_a08);
    if (fVar6 == FDB_RESULT_KEY_NOT_FOUND) {
      ppfStack_a28 = (fdb_doc **)0x11290d;
      fdb_close((fdb_file_handle *)pfStack_a10);
      ppfStack_a28 = (fdb_doc **)0x112917;
      fdb_doc_free((fdb_doc *)pfStack_a08);
      pfStack_a08 = (fdb_kvs_handle *)0x0;
      lVar14 = 0;
      do {
        ppfStack_a28 = (fdb_doc **)0x11292c;
        fdb_doc_free(apfStack_9c0[lVar14]);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x1e);
      ppfStack_a28 = (fdb_doc **)0x11293a;
      fdb_shutdown();
      ppfStack_a28 = (fdb_doc **)0x11293f;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (db_destroy_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      ppfStack_a28 = (fdb_doc **)0x112970;
      fprintf(_stderr,pcVar18,"Database destroy test");
      return;
    }
  }
  else {
    ppfStack_a28 = (fdb_doc **)0x112987;
    db_destroy_test();
LAB_00112987:
    ppfStack_a28 = (fdb_doc **)0x11298c;
    db_destroy_test();
LAB_0011298c:
    ppfStack_a28 = (fdb_doc **)0x112991;
    db_destroy_test();
LAB_00112991:
    ppfStack_a28 = (fdb_doc **)0x112996;
    db_destroy_test();
LAB_00112996:
    ppfStack_a28 = (fdb_doc **)0x11299b;
    db_destroy_test();
  }
  ppfStack_a28 = (fdb_doc **)db_destroy_test_full_path;
  db_destroy_test();
  pfVar22 = (fdb_doc *)auStack_d48;
  pfVar20 = (fdb_doc *)auStack_d48;
  pcStack_d50 = (code *)0x1129b8;
  ppfStack_a38 = ppfVar15;
  pfStack_a30 = pfVar10;
  ppfStack_a28 = doc;
  gettimeofday((timeval *)(auStack_d48 + 8),(__timezone_ptr_t)0x0);
  pcStack_d50 = (code *)0x1129bd;
  memleak_start();
  pcStack_d50 = (code *)0x1129c4;
  tVar11 = time((time_t *)0x0);
  pcStack_d50 = (code *)0x1129cb;
  srand((uint)tVar11);
  pcStack_d50 = (code *)0x1129d0;
  iVar7 = rand();
  pcStack_d50 = (code *)0x112a08;
  sprintf(acStack_b38,"/tmp/fdb_destroy_test_%d",(ulong)(uint)(iVar7 % 10000));
  pcStack_d50 = (code *)0x112a24;
  sprintf(acStack_c38,"rm -rf %s*",acStack_b38);
  pcStack_d50 = (code *)0x112a2c;
  system(acStack_c38);
  pcStack_d50 = (code *)0x112a39;
  fdb_get_default_config();
  fStack_d30.compaction_mode = '\x01';
  pcStack_d50 = (code *)0x112a4f;
  fdb_open((fdb_file_handle **)auStack_d48,acStack_b38,&fStack_d30);
  pcStack_d50 = (code *)0x112a57;
  fdb_close((fdb_file_handle *)auStack_d48._0_8_);
  pcStack_d50 = (code *)0x112a62;
  pcVar18 = acStack_b38;
  fVar6 = fdb_destroy(acStack_b38,&fStack_d30);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pcStack_d50 = (code *)0x112a6b;
    fdb_shutdown();
    pcStack_d50 = (code *)0x112a70;
    memleak_end();
    pcVar18 = "%s PASSED\n";
    if (db_destroy_test_full_path()::__test_pass != '\0') {
      pcVar18 = "%s FAILED\n";
    }
    pcStack_d50 = (code *)0x112aa1;
    fprintf(_stderr,pcVar18,"Database destroy (full path) test");
    return;
  }
  pcStack_d50 = operational_stats_test;
  db_destroy_test_full_path();
  info = (char *)((ulong)pcVar18 & 0xffffffff);
  info_00 = (char *)0x0;
  pkStack_1228 = (kvs_ops_stat *)0x112ad8;
  pcStack_d78 = acStack_b38;
  pfStack_d70 = unaff_R12;
  pfStack_d68 = (fdb_doc *)unaff_R13;
  pfStack_d60 = &fStack_d30;
  puStack_d58 = auStack_d48;
  pcStack_d50 = (code *)unaff_RBP;
  gettimeofday((timeval *)(auStack_1138 + 0x18),(__timezone_ptr_t)0x0);
  pkStack_1228 = (kvs_ops_stat *)0x112add;
  memleak_start();
  pfStack_1208 = (fdb_doc *)auStack_fc0;
  auStack_11d0._0_16_ = (undefined1  [16])0x0;
  auStack_11d0._16_8_ = (void *)0x0;
  auStack_11d0._24_8_ = (kvs_info *)0x0;
  auStack_11d0._32_8_ = (kvs_ops_stat *)0x0;
  auStack_11d0._40_8_ = (fdb_file_handle *)0x0;
  auStack_11d0._48_8_ = (hbtrie *)0x0;
  auStack_fc0 = (undefined1  [16])0x0;
  auStack_fb0 = (undefined1  [16])0x0;
  auStack_f90 = (undefined1  [16])0x0;
  auStack_fa0._8_8_ = 0;
  auStack_fa0._0_8_ = acStack_10c0;
  auStack_f80._8_8_ = 0;
  auStack_f80._0_8_ = afStack_f70;
  pkStack_1228 = (kvs_ops_stat *)0x112b44;
  system("rm -rf  dummy* > errorlog.txt");
  fconfig_00 = &fStack_e70;
  pkStack_1228 = (kvs_ops_stat *)0x112b54;
  fdb_get_default_config();
  pkStack_1228 = (kvs_ops_stat *)0x112b61;
  fdb_get_default_kvs_config();
  fStack_e70.buffercache_size = 0;
  fStack_e70.seqtree_opt = '\x01';
  fStack_e70.wal_threshold = 0x400;
  fStack_e70.flags = 1;
  fStack_e70.compaction_threshold = '\0';
  fStack_e70.multi_kv_instances = SUB81(info,0);
  pkStack_1228 = (kvs_ops_stat *)0x112b94;
  fdb_open((fdb_file_handle **)&pfStack_1210,"./dummy1",fconfig_00);
  uStack_11f8._4_4_ = (int)pcVar18;
  if (uStack_11f8._4_4_ != 0) {
    fconfig_00 = (fdb_config *)0x3;
    info_00 = (char *)0x18;
    pfVar22 = (fdb_doc *)(auStack_1190 + 0x20);
    unaff_R12 = (fdb_doc *)auStack_1138;
    unaff_R13 = logCallbackFunc;
    info = "operational_stats_test";
    do {
      pkStack_1228 = (kvs_ops_stat *)0x112bdc;
      sprintf((char *)pfVar22,"kv%d",(ulong)fconfig_00 & 0xffffffff);
      pkStack_1228 = (kvs_ops_stat *)0x112bf4;
      fVar6 = fdb_kvs_open((fdb_file_handle *)pfStack_1210,
                           (fdb_kvs_handle **)((long)apfStack_11f0 + (long)info_00),(char *)pfVar22,
                           (fdb_kvs_config *)unaff_R12);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011316d;
      pkStack_1228 = (kvs_ops_stat *)0x112c0c;
      fVar6 = fdb_set_log_callback
                        (apfStack_11f0[(long)fconfig_00],logCallbackFunc,"operational_stats_test");
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113168;
      info_00 = (char *)&((btree *)((long)info_00 + -0x38))->aux;
      bVar23 = fconfig_00 != (fdb_config *)0x0;
      fconfig_00 = (fdb_config *)&fconfig_00[-1].field_0xf7;
    } while (bVar23);
    auStack_11d0._56_8_ = (btree *)0x3;
LAB_00112c66:
    puVar12 = &((btree *)auStack_11d0._56_8_)->vsize;
    info = auStack_1190 + 0x20;
    fconfig_00 = (fdb_config *)auStack_11d0;
    info_00 = (char *)0x0;
    do {
      pkStack_1228 = (kvs_ops_stat *)0x112ca2;
      sprintf(acStack_10c0,"key%d",(ulong)info_00 & 0xffffffff);
      unaff_R13 = (code *)afStack_f70;
      pkStack_1228 = (kvs_ops_stat *)0x112cbe;
      sprintf((char *)unaff_R13,"body%d",(ulong)info_00 & 0xffffffff);
      unaff_R12 = (fdb_doc *)(&fStack_1110.keylen + (long)info_00);
      pkStack_1228 = (kvs_ops_stat *)0x112cd1;
      sVar8 = strlen(acStack_10c0);
      pkStack_1228 = (kvs_ops_stat *)0x112cdd;
      sVar9 = strlen((char *)unaff_R13);
      pkStack_1228 = (kvs_ops_stat *)0x112cff;
      fdb_doc_create((fdb_doc **)unaff_R12,acStack_10c0,sVar8 + 1,(void *)0x0,0,unaff_R13,sVar9 + 1)
      ;
      info_00 = (char *)((long)info_00 + 1);
      pfVar22 = (fdb_doc *)puVar12;
      do {
        pkStack_1228 = (kvs_ops_stat *)0x112d15;
        fVar6 = fdb_set((fdb_kvs_handle *)(&uStack_11f8)[(long)pfVar22],(fdb_doc *)unaff_R12->keylen
                       );
        if (fVar6 != FDB_RESULT_SUCCESS) {
          pkStack_1228 = (kvs_ops_stat *)0x1130fe;
          operational_stats_test();
LAB_001130fe:
          pkStack_1228 = (kvs_ops_stat *)0x113103;
          operational_stats_test();
LAB_00113103:
          pkStack_1228 = (kvs_ops_stat *)0x113115;
          operational_stats_test();
          goto LAB_00113115;
        }
        pkStack_1228 = (kvs_ops_stat *)0x112d2a;
        fVar6 = fdb_get_kvs_ops_info
                          ((fdb_kvs_handle *)(&uStack_11f8)[(long)pfVar22],(fdb_kvs_ops_info *)info)
        ;
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001130fe;
        auStack_11d0._0_8_ = info_00;
        pkStack_1228 = (kvs_ops_stat *)0x112d47;
        iVar7 = bcmp(info,fconfig_00,0x38);
        if (iVar7 != 0) goto LAB_00113103;
        puVar5 = (undefined1 *)((long)&pfVar22[-1].flags + 3);
        bVar23 = 0 < (long)pfVar22;
        pfVar22 = (fdb_doc *)puVar5;
      } while (puVar5 != (undefined1 *)0x0 && bVar23);
    } while (info_00 != (char *)0xa);
    info_00 = auStack_1190 + 0x20;
    pbStack_1218 = (btree *)auStack_11d0._56_8_;
    do {
      pkStack_1228 = (kvs_ops_stat *)0x112d98;
      fdb_iterator_init(apfStack_11f0[(long)pbStack_1218],&pfStack_1200,(void *)0x0,0,(void *)0x0,0,
                        0);
      pfVar22 = &fStack_1110;
      pfVar20 = (fdb_doc *)unaff_R13;
      do {
        pkStack_1228 = (kvs_ops_stat *)0x112daf;
        fVar6 = fdb_iterator_get(pfStack_1200,&pfStack_1208);
        unaff_R13 = (code *)pfStack_1208;
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113131;
        fconfig_00 = (fdb_config *)pfStack_1208->key;
        unaff_R12 = (fdb_doc *)pfVar22->keylen;
        info = (char *)unaff_R12->key;
        pkStack_1228 = (kvs_ops_stat *)0x112dd7;
        iVar7 = bcmp(fconfig_00,info,pfStack_1208->keylen);
        if (iVar7 != 0) goto LAB_00113136;
        fconfig_00 = (fdb_config *)((fdb_doc *)unaff_R13)->body;
        info = (char *)unaff_R12->body;
        pkStack_1228 = (kvs_ops_stat *)0x112df7;
        iVar7 = bcmp(fconfig_00,info,((fdb_doc *)unaff_R13)->bodylen);
        if (iVar7 != 0) goto LAB_00113158;
        pkStack_1228 = (kvs_ops_stat *)0x112e11;
        fVar6 = fdb_get_kvs_ops_info(apfStack_11f0[(long)pbStack_1218],(fdb_kvs_ops_info *)info_00);
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113141;
        auStack_11d0._40_8_ = (long)(fdb_kvs_handle **)auStack_11d0._40_8_ + 1;
        auStack_11d0._48_8_ = auStack_11d0._48_8_ + 1;
        pkStack_1228 = (kvs_ops_stat *)0x112e3f;
        iVar7 = bcmp(info_00,auStack_11d0,0x38);
        if (iVar7 != 0) goto LAB_00113146;
        pkStack_1228 = (kvs_ops_stat *)0x112e51;
        fVar6 = fdb_iterator_next(pfStack_1200);
        pfVar22 = (fdb_doc *)&pfVar22->metalen;
        pfVar20 = (fdb_doc *)unaff_R13;
      } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
      auStack_11d0._48_8_ = auStack_11d0._48_8_ + 1;
      pkStack_1228 = (kvs_ops_stat *)0x112e70;
      fdb_iterator_close(pfStack_1200);
      pkStack_1228 = (kvs_ops_stat *)0x112e7f;
      fdb_commit((fdb_file_handle *)pfStack_1210,'\x01');
      auStack_11d0._16_8_ = (void *)(auStack_11d0._16_8_ + 1);
      pkStack_1228 = (kvs_ops_stat *)0x112e96;
      fVar6 = fdb_get_kvs_ops_info(apfStack_11f0[(long)pbStack_1218],(fdb_kvs_ops_info *)info_00);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113184;
      pkStack_1228 = (kvs_ops_stat *)0x112eb0;
      iVar7 = bcmp(info_00,auStack_11d0,0x38);
      if (iVar7 != 0) goto LAB_00113172;
    } while ((pbStack_1218 != (btree *)0x0) &&
            (auStack_11d0._40_8_ = (fdb_file_handle *)0x0, auStack_11d0._48_8_ = (hbtrie *)0x0,
            bVar23 = 0 < (long)pbStack_1218,
            pbStack_1218 = (btree *)((long)&pbStack_1218[-1].aux + 7), bVar23));
    auStack_11d0._24_8_ = auStack_11d0._24_8_ + 1;
    pkStack_1228 = (kvs_ops_stat *)0x112ee9;
    fdb_compact((fdb_file_handle *)pfStack_1210,"./dummy2");
    pkStack_1228 = (kvs_ops_stat *)0x112efb;
    fVar6 = fdb_get_kvs_ops_info(apfStack_11f0[0],(fdb_kvs_ops_info *)(auStack_1190 + 0x20));
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113189;
    pkStack_1228 = (kvs_ops_stat *)0x112f1a;
    iVar7 = bcmp(auStack_1190 + 0x20,auStack_11d0,0x38);
    info_00 = (char *)auStack_11d0._56_8_;
    if (iVar7 == 0) {
      pfVar22 = (fdb_doc *)(auStack_11d0._56_8_ + 1);
      unaff_R12 = (fdb_doc *)(auStack_1190 + 0x20);
      unaff_R13 = (code *)auStack_11d0;
      pkVar17 = (kvs_ops_stat *)0x0;
      do {
        fconfig_00 = (fdb_config *)((ulong)pkVar17 & 0xffffffff);
        pkStack_1228 = (kvs_ops_stat *)0x112f56;
        sprintf(acStack_10c0,"key%d",(ulong)pkVar17 & 0xffffffff);
        info = (char *)((long)&(pkVar17->num_sets).super___atomic_base<unsigned_long>._M_i + 1);
        info_00 = (char *)pfVar22;
        do {
          if (((ulong)pkVar17 & 1) == 0) {
            if (((ulong)pkVar17 & 2) == 0) {
              pkStack_1228 = (kvs_ops_stat *)0x112f75;
              fVar6 = fdb_get_metaonly((fdb_kvs_handle *)(&uStack_11f8)[(long)info_00],pfStack_1208)
              ;
            }
            else {
              pfStack_1208->seqnum = (fdb_seqnum_t)info;
              pkStack_1228 = (kvs_ops_stat *)0x112f9b;
              fVar6 = fdb_get_byseq((fdb_kvs_handle *)(&uStack_11f8)[(long)info_00],pfStack_1208);
            }
          }
          else {
            pkStack_1228 = (kvs_ops_stat *)0x112f86;
            fVar6 = fdb_get((fdb_kvs_handle *)(&uStack_11f8)[(long)info_00],pfStack_1208);
          }
          if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113115;
          pkStack_1228 = (kvs_ops_stat *)0x112fb0;
          fVar6 = fdb_get_kvs_ops_info
                            ((fdb_kvs_handle *)(&uStack_11f8)[(long)info_00],
                             (fdb_kvs_ops_info *)unaff_R12);
          if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011311a;
          pkStack_1228 = (kvs_ops_stat *)0x112fcd;
          auStack_11d0._32_8_ = info;
          iVar7 = bcmp(unaff_R12,unaff_R13,0x38);
          if (iVar7 != 0) goto LAB_0011311f;
          pbVar21 = (btree *)((long)&((btree *)((long)info_00 + -0x38))->aux + 7);
          bVar23 = 0 < (long)info_00;
          info_00 = (char *)pbVar21;
        } while (pbVar21 != (btree *)0x0 && bVar23);
        pkVar17 = (kvs_ops_stat *)info;
      } while ((kvs_ops_stat *)info != (kvs_ops_stat *)0xa);
      fconfig_00 = (fdb_config *)auStack_1190;
      pfVar22 = (fdb_doc *)&stderr;
      info_00 = "%d:\t%u\t%u\t%u\t%lu\n";
      info = (char *)0x0;
      while( true ) {
        auStack_1190._0_16_ = (undefined1  [16])0x0;
        auStack_1190._16_8_ = (docio_handle *)0x0;
        pkStack_1228 = (kvs_ops_stat *)0x113029;
        fVar6 = fdb_get_latency_stats
                          ((fdb_file_handle *)pfStack_1210,(fdb_latency_stat *)fconfig_00,
                           (fdb_latency_stat_type)info);
        if (fVar6 != FDB_RESULT_SUCCESS) break;
        pkStack_1228 = (kvs_ops_stat *)0x11305e;
        fprintf(_stderr,"%d:\t%u\t%u\t%u\t%lu\n",info);
        uVar16 = (int)info + 1;
        info = (char *)(ulong)uVar16;
        if (uVar16 == 0x13) {
          pkStack_1228 = (kvs_ops_stat *)0x11306f;
          fdb_close((fdb_file_handle *)pfStack_1210);
          lVar14 = 0;
          do {
            pkStack_1228 = (kvs_ops_stat *)0x11307e;
            fdb_doc_free((fdb_doc *)(&fStack_1110.keylen)[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 10);
          pkStack_1228 = (kvs_ops_stat *)0x11308c;
          fdb_shutdown();
          pkStack_1228 = (kvs_ops_stat *)0x113091;
          memleak_end();
          pcVar18 = "single kv instance";
          if (uStack_11f8._4_1_ != '\0') {
            pcVar18 = "multiple kv instances";
          }
          pkStack_1228 = (kvs_ops_stat *)0x1130c1;
          sprintf((char *)afStack_f70,"Operational stats test %s",pcVar18);
          pcVar18 = "%s PASSED\n";
          if (operational_stats_test(bool)::__test_pass != '\0') {
            pcVar18 = "%s FAILED\n";
          }
          pkStack_1228 = (kvs_ops_stat *)0x1130e7;
          fprintf(_stderr,pcVar18,afStack_f70);
          return;
        }
      }
      goto LAB_00113163;
    }
    goto LAB_0011318e;
  }
  pkStack_1228 = (kvs_ops_stat *)0x112c3c;
  pfVar19 = pfStack_1210;
  fVar6 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_1210,apfStack_11f0,(fdb_kvs_config *)auStack_1138);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pkStack_1228 = (kvs_ops_stat *)0x112c5c;
    pfVar19 = apfStack_11f0[0];
    fVar6 = fdb_set_log_callback(apfStack_11f0[0],logCallbackFunc,"operational_stats_test");
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001131a5;
    auStack_11d0._56_8_ = (btree *)0x0;
    goto LAB_00112c66;
  }
  goto LAB_001131a0;
LAB_00113115:
  pkStack_1228 = (kvs_ops_stat *)0x11311a;
  operational_stats_test();
LAB_0011311a:
  pkStack_1228 = (kvs_ops_stat *)0x11311f;
  operational_stats_test();
LAB_0011311f:
  pkStack_1228 = (kvs_ops_stat *)0x113131;
  operational_stats_test();
  pfVar20 = (fdb_doc *)unaff_R13;
LAB_00113131:
  unaff_R13 = (code *)pfVar20;
  pkStack_1228 = (kvs_ops_stat *)0x113136;
  operational_stats_test();
LAB_00113136:
  pkStack_1228 = (kvs_ops_stat *)0x113141;
  operational_stats_test();
LAB_00113141:
  pkStack_1228 = (kvs_ops_stat *)0x113146;
  operational_stats_test();
LAB_00113146:
  pkStack_1228 = (kvs_ops_stat *)0x113158;
  operational_stats_test();
LAB_00113158:
  pkStack_1228 = (kvs_ops_stat *)0x113163;
  operational_stats_test();
LAB_00113163:
  pkStack_1228 = (kvs_ops_stat *)0x113168;
  operational_stats_test();
LAB_00113168:
  pkStack_1228 = (kvs_ops_stat *)0x11316d;
  operational_stats_test();
LAB_0011316d:
  pkStack_1228 = (kvs_ops_stat *)0x113172;
  operational_stats_test();
LAB_00113172:
  pkStack_1228 = (kvs_ops_stat *)0x113184;
  operational_stats_test();
LAB_00113184:
  pkStack_1228 = (kvs_ops_stat *)0x113189;
  operational_stats_test();
LAB_00113189:
  pkStack_1228 = (kvs_ops_stat *)0x11318e;
  operational_stats_test();
LAB_0011318e:
  pfVar19 = (fdb_kvs_handle *)auStack_11d0;
  pkStack_1228 = (kvs_ops_stat *)0x1131a0;
  operational_stats_test();
LAB_001131a0:
  pkStack_1228 = (kvs_ops_stat *)0x1131a5;
  operational_stats_test();
  pfVar20 = pfVar22;
LAB_001131a5:
  pkStack_1228 = (kvs_ops_stat *)_worker_thread;
  operational_stats_test();
  pfStack_1250 = fconfig_00;
  pfStack_1248 = unaff_R12;
  pfStack_1240 = (fdb_doc *)unaff_R13;
  pbStack_1238 = (btree *)info_00;
  pfStack_1230 = pfVar20;
  pkStack_1228 = (kvs_ops_stat *)info;
  gettimeofday(&tStack_16b0,(__timezone_ptr_t)0x0);
  pfStack_16f8 = (fdb_doc *)0x0;
  sprintf(acStack_1658,"dummy%d",(ulong)*(uint *)&pfVar19->file->filename);
  fdb_open(&pfStack_16f0,acStack_1658,(fdb_config *)pfVar19->btreeblkops);
  fdb_kvs_open_default(pfStack_16f0,&pfStack_16e0,(fdb_kvs_config *)pfVar19->fileops);
  fVar6 = fdb_set_log_callback(pfStack_16e0,logCallbackFunc,"worker_thread");
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x6c4);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x6c4,"void *_worker_thread(void *)");
  }
  pthread_spin_lock((pthread_spinlock_t *)pfVar19->dhandle);
  *(int *)(pfVar19->field_6).seqtree = *(int *)(pfVar19->field_6).seqtree + 1;
  pthread_spin_unlock((pthread_spinlock_t *)pfVar19->dhandle);
  while( true ) {
    pthread_spin_lock((pthread_spinlock_t *)pfVar19->dhandle);
    pbVar21 = (pfVar19->field_6).seqtree;
    iVar7._0_1_ = pbVar21->ksize;
    iVar7._1_1_ = pbVar21->vsize;
    iVar7._2_2_ = pbVar21->height;
    if ((list *)(pfVar19->kvs_config).custom_cmp == (list *)(long)iVar7) break;
    pthread_spin_unlock((pthread_spinlock_t *)pfVar19->dhandle);
    sleep(1);
  }
  pthread_spin_unlock((pthread_spinlock_t *)pfVar19->dhandle);
  gettimeofday((timeval *)&tStack_16c0,(__timezone_ptr_t)0x0);
  uStack_16e1 = 0;
  uVar13 = 0;
  iStack_16fc = 0;
  do {
    iVar7 = rand();
    iVar7 = (int)((ulong)(long)iVar7 % (ulong)(pfVar19->kvs_config).custom_cmp_param);
    psVar1 = (size_t *)(&pfVar19->op_stats->num_sets)[iVar7].super___atomic_base<unsigned_long>._M_i
    ;
    fdb_doc_create(&pfStack_16f8,(void *)psVar1[4],*psVar1,(void *)0x0,0,(void *)0x0,0);
    fVar6 = fdb_get(pfStack_16e0,pfStack_16f8);
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e1);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e1,"void *_worker_thread(void *)");
    }
    plVar2 = (long *)pfStack_16f8->body;
    plVar3 = *(long **)((&pfVar19->op_stats->num_sets)[iVar7].super___atomic_base<unsigned_long>.
                        _M_i + 0x40);
    if (*plVar2 != *plVar3) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",plVar3,plVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e2);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e2,"void *_worker_thread(void *)");
    }
    if (pfVar19->kvs != (kvs_info *)0x0) {
      uStack_16e8 = (undefined4)plVar2[1];
      uStack_16e4 = (undefined3)((uint)*(undefined4 *)((long)plVar2 + 0xb) >> 8);
      iVar7 = atoi((char *)&uStack_16e8);
      sprintf((char *)&uStack_16e8,"%0 7d",(ulong)(iVar7 + 1));
      pvVar4 = pfStack_16f8->body;
      *(uint *)((long)pvVar4 + 0xb) = CONCAT31(uStack_16e4,uStack_16e8._3_1_);
      *(undefined4 *)((long)pvVar4 + 8) = uStack_16e8;
      fVar6 = fdb_set(pfStack_16e0,pfStack_16f8);
      if (fVar6 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x6f0);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x6f0,"void *_worker_thread(void *)");
      }
      if ((pfVar19->trie != (hbtrie *)0x0) && (uVar13 % (ulong)pfVar19->trie == 0)) {
        fdb_commit(pfStack_16f0,'\0');
        iStack_16fc = iStack_16fc + 1;
        fdb_get_file_info(pfStack_16f0,&fStack_16a0);
        if ((pfVar19->staletree == (btree *)(long)iStack_16fc) &&
           (((pfVar19->staletree != (btree *)0x0 && (fStack_16a0.new_filename == (char *)0x0)) &&
            (*(int *)&pfVar19->kvs_config == 0)))) {
          pthread_spin_lock((pthread_spinlock_t *)pfVar19->dhandle);
          uStack_16d4 = *(int *)&pfVar19->file->filename + 1;
          *(uint *)&pfVar19->file->filename = uStack_16d4;
          pthread_spin_unlock((pthread_spinlock_t *)pfVar19->dhandle);
          iStack_16fc = 0;
          sprintf(acStack_1658,"dummy%d",(ulong)uStack_16d4);
          fVar6 = fdb_compact(pfStack_16f0,acStack_1658);
          if (fVar6 != FDB_RESULT_SUCCESS) {
            pthread_spin_lock((pthread_spinlock_t *)pfVar19->dhandle);
            *(int *)&pfVar19->file->filename = *(int *)&pfVar19->file->filename + -1;
            pthread_spin_unlock((pthread_spinlock_t *)pfVar19->dhandle);
          }
        }
      }
    }
    fdb_doc_free(pfStack_16f8);
    pfStack_16f8 = (fdb_doc *)0x0;
    uVar13 = uVar13 + 1;
    gettimeofday((timeval *)&tStack_16d0,(__timezone_ptr_t)0x0);
    tVar24 = _utime_gap(tStack_16c0,tStack_16d0);
  } while ((fdb_file_handle *)tVar24.tv_sec < pfVar19->fhandle);
  pcVar18 = "writer";
  if (pfVar19->kvs == (kvs_info *)0x0) {
    pcVar18 = "reader";
  }
  printf("Thread #%d (%s) %d ops / %d seconds\n",(ulong)*(uint *)&pfVar19->kvs_config,pcVar18,
         uVar13 & 0xffffffff);
  pfVar19->bhandle = (btreeblk_handle *)(uVar13 & 0xffffffff);
  fdb_commit(pfStack_16f0,'\x01');
  fdb_kvs_close(pfStack_16e0);
  fdb_close(pfStack_16f0);
  pthread_exit((void *)0x0);
}

Assistant:

void db_drop_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 3;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_drop_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert first two documents
    for (i=0;i<2;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // Remove the database file manually.
    r = system(SHELL_DEL " dummy1 > errorlog.txt");
    (void)r;

    // Open the empty db with the same name.
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_drop_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // now insert a new doc.
    sprintf(keybuf, "key%d", 0);
    sprintf(metabuf, "meta%d", 0);
    sprintf(bodybuf, "body%d", 0);
    fdb_doc_free(doc[0]);
    fdb_doc_create(&doc[0], (void*)keybuf, strlen(keybuf),
        (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc[0]);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // search by key
    fdb_doc_create(&rdoc, doc[0]->key, doc[0]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // Make sure that a doc seqnum starts with one.
    TEST_CHK(rdoc->seqnum == 1);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    fdb_doc_free(rdoc);
    rdoc = NULL;
    for (i=0;i<2;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("Database drop test");
}